

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::Run(Application *this)

{
  int iVar1;
  Application *in_RDI;
  float unaff_retaddr;
  GLFWwindow *in_stack_00000008;
  double cur_time;
  double lst_time;
  Application *in_stack_00000060;
  GLFWwindow *in_stack_ffffffffffffffd8;
  
  glfwGetTime();
  while( true ) {
    iVar1 = glfwWindowShouldClose(in_stack_ffffffffffffffd8);
    if (iVar1 != 0) break;
    glfwGetTime();
    glfwPollEvents();
    if (in_RDI->m_ui_state == kOctreeTracer) {
      std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11e45b);
      Camera::Control((Camera *)cur_time,in_stack_00000008,unaff_retaddr);
    }
    ui_switch_state(in_RDI);
    ImGui_ImplGlfw_NewFrame();
    ImGui::NewFrame();
    if ((in_RDI->m_ui_display_flag & 1U) != 0) {
      ui_render_main(in_RDI);
    }
    ImGui::Render();
    draw_frame(in_stack_00000060);
  }
  return;
}

Assistant:

void Application::Run() {
	double lst_time = glfwGetTime();
	while (!glfwWindowShouldClose(m_window)) {
		double cur_time = glfwGetTime();

		glfwPollEvents();

		if (m_ui_state == UIStates::kOctreeTracer)
			m_camera->Control(m_window, float(cur_time - lst_time));

		ui_switch_state();

		ImGui_ImplGlfw_NewFrame();
		ImGui::NewFrame();
		if (m_ui_display_flag)
			ui_render_main();
		ImGui::Render();

		draw_frame();
		lst_time = cur_time;
	}
}